

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  string local_208;
  undefined1 local_1e8 [8];
  TestCaseInfo info;
  allocator local_132;
  allocator local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  iterator local_e8;
  size_type local_e0;
  undefined1 local_d8 [16];
  SpecialProperties local_c8;
  char local_c1;
  SpecialProperties prop;
  char c;
  const_iterator __end1;
  char *local_a8;
  const_iterator __begin1;
  StringRef *__range1;
  undefined1 local_90 [7];
  bool inTag;
  string tag;
  string desc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  bool isHidden;
  SourceLineInfo *_lineInfo_local;
  NameAndTags *nameAndTags_local;
  string *_className_local;
  ITestInvoker *_testCase_local;
  
  bVar1 = false;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&desc.field_2 + 8));
  std::__cxx11::string::string((string *)(tag.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_90);
  __range1._7_1_ = 0;
  __begin1 = (const_iterator)&nameAndTags->tags;
  local_a8 = StringRef::begin((StringRef *)__begin1);
  _prop = StringRef::end((StringRef *)__begin1);
  for (; local_a8 != _prop; local_a8 = local_a8 + 1) {
    local_c1 = *local_a8;
    if ((__range1._7_1_ & 1) == 0) {
      if (local_c1 == '[') {
        __range1._7_1_ = 1;
      }
      else {
        std::__cxx11::string::operator+=((string *)(tag.field_2._M_local_buf + 8),local_c1);
      }
    }
    else if (local_c1 == ']') {
      local_c8 = anon_unknown_1::parseSpecialTag((string *)local_90);
      if ((local_c8 & IsHidden) == None) {
        if (local_c8 == None) {
          anon_unknown_1::enforceNotReservedTag((string *)local_90,_lineInfo);
        }
      }
      else {
        bVar1 = true;
      }
      bVar2 = startsWith((string *)local_90,'.');
      if ((bVar2) && (uVar3 = std::__cxx11::string::size(), 1 < uVar3)) {
        std::__cxx11::string::erase((ulong)local_90,0);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&desc.field_2 + 8),(value_type *)local_90);
      std::__cxx11::string::clear();
      __range1._7_1_ = 0;
    }
    else {
      std::__cxx11::string::operator+=((string *)local_90,local_c1);
    }
  }
  if (bVar1) {
    local_d8._0_8_ =
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&desc.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)(local_d8 + 8),
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_d8);
    local_130 = &local_128;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,".",&local_131);
    local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"!hide",&local_132);
    local_e8 = &local_128;
    local_e0 = 2;
    __l._M_len = 2;
    __l._M_array = local_e8;
    info._160_8_ = clara::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&desc.field_2 + 8),(const_iterator)local_d8._8_8_,__l);
    local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8;
    do {
      local_260 = local_260 + -1;
      std::__cxx11::string::~string((string *)local_260);
    } while (local_260 != &local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_132);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  StringRef::operator_cast_to_string(&local_208,&nameAndTags->name);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_1e8,&local_208,_className,(string *)((long)&tag.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&desc.field_2 + 8),_lineInfo);
  std::__cxx11::string::~string((string *)&local_208);
  TestCase::TestCase(__return_storage_ptr__,_testCase,(TestCaseInfo *)local_1e8);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_1e8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(tag.field_2._M_local_buf + 8));
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&desc.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for (char c : nameAndTags.tags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            // Add all "hidden" tags to make them behave identically
            tags.insert( tags.end(), { ".", "!hide" } );
        }

        TestCaseInfo info( static_cast<std::string>(nameAndTags.name), _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }